

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Scene *pSVar9;
  Ref<embree::Geometry> *pRVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  AABBNodeMB4D *node1;
  ulong uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong *puVar32;
  RTCIntersectArguments *pRVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar66 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  undefined1 auVar89 [32];
  undefined4 uVar90;
  float fVar91;
  undefined1 auVar92 [16];
  undefined8 uVar93;
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [32];
  undefined1 in_ZMM29 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  int local_15e4;
  RTCIntersectArguments *local_15e0;
  Geometry *local_15d8;
  long local_15d0;
  long local_15c8;
  undefined4 local_15c0;
  undefined4 local_15bc;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined4 local_15ac;
  uint local_15a8;
  uint local_15a4;
  uint local_15a0;
  RTCFilterFunctionNArguments local_1590;
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  float local_14e0;
  float fStack_14dc;
  float fStack_14d8;
  float fStack_14d4;
  float fStack_14d0;
  float fStack_14cc;
  float fStack_14c8;
  float fStack_14c4;
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  float fStack_1464;
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  uint uStack_1304;
  byte local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  undefined4 uStack_1244;
  undefined1 local_1240 [32];
  undefined1 local_1220;
  ulong local_1200;
  ulong local_11f8 [569];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_1200 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200 != 8) {
    fVar99 = ray->tfar;
    vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar60 = vucomiss_avx512f(ZEXT416((uint)fVar99));
    auVar120 = ZEXT1664(auVar60);
    if (local_1200 < 9) {
      aVar8 = (ray->dir).field_0;
      auVar36 = vmaxss_avx512f(auVar60,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar37 = vandps_avx512vl((undefined1  [16])aVar8,auVar37);
      auVar38._8_4_ = 0x219392ef;
      auVar38._0_8_ = 0x219392ef219392ef;
      auVar38._12_4_ = 0x219392ef;
      uVar28 = vcmpps_avx512vl(auVar37,auVar38,1);
      auVar58._8_4_ = 0x3f800000;
      auVar58._0_8_ = 0x3f8000003f800000;
      auVar58._12_4_ = 0x3f800000;
      puVar32 = local_11f8;
      auVar37 = vdivps_avx(auVar58,(undefined1  [16])aVar8);
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar35 = (bool)((byte)uVar28 & 1);
      auVar45._0_4_ = (uint)bVar35 * auVar38._0_4_ | (uint)!bVar35 * auVar37._0_4_;
      bVar35 = (bool)((byte)(uVar28 >> 1) & 1);
      auVar45._4_4_ = (uint)bVar35 * auVar38._4_4_ | (uint)!bVar35 * auVar37._4_4_;
      bVar35 = (bool)((byte)(uVar28 >> 2) & 1);
      auVar45._8_4_ = (uint)bVar35 * auVar38._8_4_ | (uint)!bVar35 * auVar37._8_4_;
      bVar35 = (bool)((byte)(uVar28 >> 3) & 1);
      auVar45._12_4_ = (uint)bVar35 * auVar38._12_4_ | (uint)!bVar35 * auVar37._12_4_;
      auVar39._8_4_ = 0x3f7ffffa;
      auVar39._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar39._12_4_ = 0x3f7ffffa;
      vmulps_avx512vl(auVar45,auVar39);
      auVar53._8_4_ = 0x3f800003;
      auVar53._0_8_ = 0x3f8000033f800003;
      auVar53._12_4_ = 0x3f800003;
      auVar39 = vmulps_avx512vl(auVar45,auVar53);
      auVar63 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar121 = ZEXT3264(auVar63);
      auVar63 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar122 = ZEXT3264(auVar63);
      uVar90 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar98 = ZEXT3264(CONCAT428(uVar90,CONCAT424(uVar90,CONCAT420(uVar90,CONCAT416(uVar90,
                                                  CONCAT412(uVar90,CONCAT48(uVar90,CONCAT44(uVar90,
                                                  uVar90))))))));
      auVar38 = vucomiss_avx512f(auVar60);
      fVar91 = auVar38._0_4_;
      auVar37 = vmovshdup_avx(auVar38);
      uVar93 = auVar37._0_8_;
      auVar107 = ZEXT3264(CONCAT824(uVar93,CONCAT816(uVar93,CONCAT88(uVar93,uVar93))));
      vshufpd_avx(auVar38,auVar38,1);
      auVar64._8_4_ = 2;
      auVar64._0_8_ = 0x200000002;
      auVar64._12_4_ = 2;
      auVar64._16_4_ = 2;
      auVar64._20_4_ = 2;
      auVar64._24_4_ = 2;
      auVar64._28_4_ = 2;
      auVar63 = vpermps_avx2(auVar64,ZEXT1632(auVar38));
      auVar109 = ZEXT3264(auVar63);
      fVar88 = auVar39._0_4_;
      auVar63._8_4_ = 1;
      auVar63._0_8_ = 0x100000001;
      auVar63._12_4_ = 1;
      auVar63._16_4_ = 1;
      auVar63._20_4_ = 1;
      auVar63._24_4_ = 1;
      auVar63._28_4_ = 1;
      auVar63 = vpermps_avx2(auVar63,ZEXT1632(auVar39));
      auVar117 = ZEXT3264(auVar63);
      auVar63 = vpermps_avx2(auVar64,ZEXT1632(auVar39));
      auVar97 = ZEXT3264(auVar63);
      vucomiss_avx512f(auVar60);
      vucomiss_avx512f(auVar60);
      uVar90 = auVar36._0_4_;
      auVar95 = ZEXT3264(CONCAT428(uVar90,CONCAT424(uVar90,CONCAT420(uVar90,CONCAT416(uVar90,
                                                  CONCAT412(uVar90,CONCAT48(uVar90,CONCAT44(uVar90,
                                                  uVar90))))))));
      auVar118 = ZEXT3264(CONCAT428(fVar99,CONCAT424(fVar99,CONCAT420(fVar99,CONCAT416(fVar99,
                                                  CONCAT412(fVar99,CONCAT48(fVar99,CONCAT44(fVar99,
                                                  fVar99))))))));
      fVar99 = fVar91;
      fVar100 = fVar91;
      fVar101 = fVar91;
      fVar102 = fVar91;
      fVar103 = fVar91;
      fVar104 = fVar91;
      fVar105 = fVar91;
      fVar110 = fVar88;
      fVar111 = fVar88;
      fVar112 = fVar88;
      fVar113 = fVar88;
      fVar114 = fVar88;
      fVar115 = fVar88;
      fVar116 = fVar88;
      do {
        uVar28 = puVar32[-1];
        puVar32 = puVar32 + -1;
        while( true ) {
          local_1460 = auVar98._0_32_;
          if ((uVar28 & 8) != 0) break;
          uVar22 = uVar28 & 0xfffffffffffffff0;
          uVar90 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
          auVar86._4_4_ = uVar90;
          auVar86._0_4_ = uVar90;
          auVar86._8_4_ = uVar90;
          auVar86._12_4_ = uVar90;
          auVar86._16_4_ = uVar90;
          auVar86._20_4_ = uVar90;
          auVar86._24_4_ = uVar90;
          auVar86._28_4_ = uVar90;
          auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x100),auVar86,
                                    *(undefined1 (*) [32])(uVar22 + 0x40));
          auVar63 = vsubps_avx512vl(ZEXT1632(auVar60),auVar121._0_32_);
          auVar66._4_4_ = fVar99 * auVar63._4_4_;
          auVar66._0_4_ = fVar91 * auVar63._0_4_;
          auVar66._8_4_ = fVar100 * auVar63._8_4_;
          auVar66._12_4_ = fVar101 * auVar63._12_4_;
          auVar66._16_4_ = fVar102 * auVar63._16_4_;
          auVar66._20_4_ = fVar103 * auVar63._20_4_;
          auVar66._24_4_ = fVar104 * auVar63._24_4_;
          auVar66._28_4_ = auVar63._28_4_;
          auVar63 = vmaxps_avx(auVar95._0_32_,auVar66);
          auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x140),auVar86,
                                    *(undefined1 (*) [32])(uVar22 + 0x80));
          auVar64 = vsubps_avx512vl(ZEXT1632(auVar60),auVar122._0_32_);
          auVar16._4_4_ = auVar107._4_4_ * auVar64._4_4_;
          auVar16._0_4_ = auVar107._0_4_ * auVar64._0_4_;
          auVar16._8_4_ = auVar107._8_4_ * auVar64._8_4_;
          auVar16._12_4_ = auVar107._12_4_ * auVar64._12_4_;
          auVar16._16_4_ = auVar107._16_4_ * auVar64._16_4_;
          auVar16._20_4_ = auVar107._20_4_ * auVar64._20_4_;
          auVar16._24_4_ = auVar107._24_4_ * auVar64._24_4_;
          auVar16._28_4_ = auVar64._28_4_;
          auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x180),auVar86,
                                    *(undefined1 (*) [32])(uVar22 + 0xc0));
          auVar64 = vsubps_avx(ZEXT1632(auVar60),local_1460);
          auVar17._4_4_ = auVar109._4_4_ * auVar64._4_4_;
          auVar17._0_4_ = auVar109._0_4_ * auVar64._0_4_;
          auVar17._8_4_ = auVar109._8_4_ * auVar64._8_4_;
          auVar17._12_4_ = auVar109._12_4_ * auVar64._12_4_;
          auVar17._16_4_ = auVar109._16_4_ * auVar64._16_4_;
          auVar17._20_4_ = auVar109._20_4_ * auVar64._20_4_;
          auVar17._24_4_ = auVar109._24_4_ * auVar64._24_4_;
          auVar17._28_4_ = auVar64._28_4_;
          auVar64 = vmaxps_avx(auVar16,auVar17);
          auVar63 = vmaxps_avx(auVar63,auVar64);
          auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x120),auVar86,
                                    *(undefined1 (*) [32])(uVar22 + 0x60));
          auVar64 = vsubps_avx512vl(ZEXT1632(auVar60),auVar121._0_32_);
          auVar18._4_4_ = fVar110 * auVar64._4_4_;
          auVar18._0_4_ = fVar88 * auVar64._0_4_;
          auVar18._8_4_ = fVar111 * auVar64._8_4_;
          auVar18._12_4_ = fVar112 * auVar64._12_4_;
          auVar18._16_4_ = fVar113 * auVar64._16_4_;
          auVar18._20_4_ = fVar114 * auVar64._20_4_;
          auVar18._24_4_ = fVar115 * auVar64._24_4_;
          auVar18._28_4_ = auVar64._28_4_;
          auVar64 = vminps_avx(auVar118._0_32_,auVar18);
          auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x160),auVar86,
                                    *(undefined1 (*) [32])(uVar22 + 0xa0));
          auVar65 = vsubps_avx512vl(ZEXT1632(auVar60),auVar122._0_32_);
          auVar19._4_4_ = auVar117._4_4_ * auVar65._4_4_;
          auVar19._0_4_ = auVar117._0_4_ * auVar65._0_4_;
          auVar19._8_4_ = auVar117._8_4_ * auVar65._8_4_;
          auVar19._12_4_ = auVar117._12_4_ * auVar65._12_4_;
          auVar19._16_4_ = auVar117._16_4_ * auVar65._16_4_;
          auVar19._20_4_ = auVar117._20_4_ * auVar65._20_4_;
          auVar19._24_4_ = auVar117._24_4_ * auVar65._24_4_;
          auVar19._28_4_ = auVar65._28_4_;
          auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar22 + 0x1a0),auVar86,
                                    *(undefined1 (*) [32])(uVar22 + 0xe0));
          auVar65 = vsubps_avx(ZEXT1632(auVar60),local_1460);
          auVar20._4_4_ = auVar97._4_4_ * auVar65._4_4_;
          auVar20._0_4_ = auVar97._0_4_ * auVar65._0_4_;
          auVar20._8_4_ = auVar97._8_4_ * auVar65._8_4_;
          auVar20._12_4_ = auVar97._12_4_ * auVar65._12_4_;
          auVar20._16_4_ = auVar97._16_4_ * auVar65._16_4_;
          auVar20._20_4_ = auVar97._20_4_ * auVar65._20_4_;
          auVar20._24_4_ = auVar97._24_4_ * auVar65._24_4_;
          auVar20._28_4_ = auVar65._28_4_;
          auVar65 = vminps_avx(auVar19,auVar20);
          auVar64 = vminps_avx(auVar64,auVar65);
          if (((uint)uVar28 & 7) == 6) {
            uVar93 = vcmpps_avx512vl(auVar63,auVar64,2);
            uVar14 = vcmpps_avx512vl(auVar86,*(undefined1 (*) [32])(uVar22 + 0x1c0),0xd);
            uVar15 = vcmpps_avx512vl(auVar86,*(undefined1 (*) [32])(uVar22 + 0x1e0),1);
            uVar24 = (uint)uVar93 & (uint)uVar14 & (uint)uVar15;
          }
          else {
            uVar93 = vcmpps_avx512vl(auVar63,auVar64,2);
            uVar24 = (uint)uVar93;
          }
          if ((byte)uVar24 == 0) goto LAB_006994be;
          lVar29 = 0;
          for (uVar28 = (ulong)(byte)uVar24; (uVar28 & 1) == 0;
              uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar29 = lVar29 + 1;
          }
          uVar28 = *(ulong *)(uVar22 + lVar29 * 8);
          uVar24 = (uVar24 & 0xff) - 1 & uVar24 & 0xff;
          uVar25 = (ulong)uVar24;
          if (uVar24 != 0) {
            *puVar32 = uVar28;
            lVar29 = 0;
            for (; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
              lVar29 = lVar29 + 1;
            }
            uVar24 = uVar24 - 1 & uVar24;
            uVar25 = (ulong)uVar24;
            bVar35 = uVar24 == 0;
            while( true ) {
              puVar32 = puVar32 + 1;
              uVar28 = *(ulong *)(uVar22 + lVar29 * 8);
              if (bVar35) break;
              *puVar32 = uVar28;
              lVar29 = 0;
              for (uVar28 = uVar25; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                lVar29 = lVar29 + 1;
              }
              uVar25 = uVar25 - 1 & uVar25;
              bVar35 = uVar25 == 0;
            }
          }
        }
        local_15d0 = (ulong)((uint)uVar28 & 0xf) - 8;
        if (local_15d0 != 0) {
          uVar28 = uVar28 & 0xfffffffffffffff0;
          pSVar9 = context->scene;
          local_15c8 = 0;
          local_1480 = fVar91;
          fStack_147c = fVar99;
          fStack_1478 = fVar100;
          fStack_1474 = fVar101;
          fStack_1470 = fVar102;
          fStack_146c = fVar103;
          fStack_1468 = fVar104;
          fStack_1464 = fVar105;
          local_14a0 = auVar107._0_32_;
          local_14c0 = auVar109._0_32_;
          local_14e0 = fVar88;
          fStack_14dc = fVar110;
          fStack_14d8 = fVar111;
          fStack_14d4 = fVar112;
          fStack_14d0 = fVar113;
          fStack_14cc = fVar114;
          fStack_14c8 = fVar115;
          fStack_14c4 = fVar116;
          local_1500 = auVar117._0_32_;
          local_1520 = auVar97._0_32_;
          local_1540 = auVar95._0_32_;
          local_1560 = auVar118._0_32_;
          do {
            lVar30 = local_15c8 * 0x60;
            pRVar10 = (pSVar9->geometries).items;
            pGVar11 = pRVar10[*(uint *)(uVar28 + 0x40 + lVar30)].ptr;
            fVar99 = (pGVar11->time_range).lower;
            fVar99 = pGVar11->fnumTimeSegments *
                     (((ray->dir).field_0.m128[3] - fVar99) / ((pGVar11->time_range).upper - fVar99)
                     );
            auVar60 = vroundss_avx(ZEXT416((uint)fVar99),ZEXT416((uint)fVar99),9);
            auVar60 = vminss_avx(auVar60,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
            auVar40 = vmaxss_avx512f(auVar120._0_16_,auVar60);
            iVar21 = (int)auVar40._0_4_;
            lVar27 = (long)iVar21 * 0x38;
            lVar29 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar27);
            auVar60 = *(undefined1 (*) [16])(lVar29 + (ulong)*(uint *)(uVar28 + lVar30) * 4);
            uVar25 = (ulong)*(uint *)(uVar28 + 0x10 + lVar30);
            auVar37 = *(undefined1 (*) [16])(lVar29 + uVar25 * 4);
            uVar26 = (ulong)*(uint *)(uVar28 + 0x20 + lVar30);
            auVar38 = *(undefined1 (*) [16])(lVar29 + uVar26 * 4);
            uVar31 = (ulong)*(uint *)(uVar28 + 0x30 + lVar30);
            auVar39 = *(undefined1 (*) [16])(lVar29 + uVar31 * 4);
            uVar22 = CONCAT44(0,*(uint *)(uVar28 + 4 + lVar30));
            local_1420._0_8_ = uVar22;
            lVar23 = (long)(iVar21 + 1) * 0x38;
            lVar29 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar23);
            auVar53 = *(undefined1 (*) [16])(lVar29 + (ulong)*(uint *)(uVar28 + lVar30) * 4);
            auVar36 = *(undefined1 (*) [16])(lVar29 + uVar25 * 4);
            lVar12 = *(long *)&pRVar10[*(uint *)(uVar28 + 0x44 + lVar30)].ptr[2].numPrimitives;
            local_1440._0_8_ = lVar27;
            lVar13 = *(long *)(lVar12 + lVar27);
            auVar45 = *(undefined1 (*) [16])(lVar13 + uVar22 * 4);
            auVar58 = *(undefined1 (*) [16])(lVar29 + uVar26 * 4);
            uVar26 = (ulong)*(uint *)(uVar28 + 0x14 + lVar30);
            auVar47 = *(undefined1 (*) [16])(lVar13 + uVar26 * 4);
            auVar61 = *(undefined1 (*) [16])(lVar29 + uVar31 * 4);
            uVar25 = (ulong)*(uint *)(uVar28 + 0x24 + lVar30);
            auVar50 = *(undefined1 (*) [16])(lVar13 + uVar25 * 4);
            uVar34 = (ulong)*(uint *)(uVar28 + 0x34 + lVar30);
            auVar52 = *(undefined1 (*) [16])(lVar13 + uVar34 * 4);
            lVar29 = *(long *)&pRVar10[*(uint *)(uVar28 + 0x48 + lVar30)].ptr[2].numPrimitives;
            lVar12 = *(long *)(lVar12 + lVar23);
            auVar55 = *(undefined1 (*) [16])(lVar12 + uVar22 * 4);
            lVar13 = *(long *)(lVar29 + lVar27);
            auVar56 = *(undefined1 (*) [16])(lVar12 + uVar26 * 4);
            uVar31 = (ulong)*(uint *)(uVar28 + 8 + lVar30);
            auVar42 = *(undefined1 (*) [16])(lVar13 + uVar31 * 4);
            auVar59 = *(undefined1 (*) [16])(lVar12 + uVar25 * 4);
            uVar22 = (ulong)*(uint *)(uVar28 + 0x18 + lVar30);
            auVar46 = *(undefined1 (*) [16])(lVar13 + uVar22 * 4);
            auVar62 = *(undefined1 (*) [16])(lVar12 + uVar34 * 4);
            uVar26 = (ulong)*(uint *)(uVar28 + 0x28 + lVar30);
            auVar49 = *(undefined1 (*) [16])(lVar13 + uVar26 * 4);
            uVar34 = (ulong)*(uint *)(uVar28 + 0x38 + lVar30);
            auVar51 = *(undefined1 (*) [16])(lVar13 + uVar34 * 4);
            lVar29 = *(long *)(lVar29 + lVar23);
            auVar54 = *(undefined1 (*) [16])(lVar29 + uVar31 * 4);
            lVar12 = *(long *)&pRVar10[*(uint *)(uVar28 + 0x4c + lVar30)].ptr[2].numPrimitives;
            lVar13 = *(long *)(lVar12 + lVar27);
            auVar57 = *(undefined1 (*) [16])(lVar29 + uVar22 * 4);
            uVar25 = (ulong)*(uint *)(uVar28 + 0xc + lVar30);
            auVar44 = *(undefined1 (*) [16])(lVar13 + uVar25 * 4);
            auVar92 = *(undefined1 (*) [16])(lVar29 + uVar26 * 4);
            uVar31 = (ulong)*(uint *)(uVar28 + 0x1c + lVar30);
            auVar48 = *(undefined1 (*) [16])(lVar13 + uVar31 * 4);
            auVar41 = vunpcklps_avx512vl(auVar60,auVar42);
            auVar42 = vunpckhps_avx512vl(auVar60,auVar42);
            auVar43 = vunpcklps_avx512vl(auVar45,auVar44);
            auVar45 = vunpckhps_avx(auVar45,auVar44);
            auVar60 = *(undefined1 (*) [16])(lVar29 + uVar34 * 4);
            uVar22 = (ulong)*(uint *)(uVar28 + 0x2c + lVar30);
            auVar42 = vunpcklps_avx(auVar42,auVar45);
            auVar44 = vunpcklps_avx512vl(auVar41,auVar43);
            auVar41 = vunpckhps_avx512vl(auVar41,auVar43);
            auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar45 = vunpcklps_avx512vl(auVar37,auVar46);
            auVar46 = vunpckhps_avx512vl(auVar37,auVar46);
            auVar43 = vunpcklps_avx512vl(auVar47,auVar48);
            auVar47 = vunpckhps_avx512vl(auVar47,auVar48);
            auVar37 = *(undefined1 (*) [16])(lVar13 + uVar22 * 4);
            uVar26 = (ulong)*(uint *)(uVar28 + 0x3c + lVar30);
            auVar47 = vunpcklps_avx(auVar46,auVar47);
            auVar46 = vunpcklps_avx512vl(auVar45,auVar43);
            auVar45 = vunpckhps_avx(auVar45,auVar43);
            auVar48 = vunpcklps_avx512vl(auVar38,auVar49);
            auVar38 = vunpckhps_avx512vl(auVar38,auVar49);
            auVar49 = vunpcklps_avx512vl(auVar50,auVar37);
            auVar50 = vunpckhps_avx512vl(auVar50,auVar37);
            auVar37 = *(undefined1 (*) [16])(lVar13 + uVar26 * 4);
            lVar29 = *(long *)(lVar12 + lVar23);
            auVar50 = vunpcklps_avx(auVar38,auVar50);
            auVar43 = vunpcklps_avx512vl(auVar48,auVar49);
            auVar38 = vunpckhps_avx(auVar48,auVar49);
            auVar49 = vunpcklps_avx512vl(auVar39,auVar51);
            auVar39 = vunpckhps_avx512vl(auVar39,auVar51);
            auVar51 = vunpcklps_avx512vl(auVar52,auVar37);
            auVar52 = vunpckhps_avx512vl(auVar52,auVar37);
            auVar37 = *(undefined1 (*) [16])(lVar29 + uVar25 * 4);
            auVar39 = vunpcklps_avx(auVar39,auVar52);
            auVar52 = vunpcklps_avx512vl(auVar49,auVar51);
            auVar49 = vunpckhps_avx512vl(auVar49,auVar51);
            auVar51 = vunpcklps_avx512vl(auVar53,auVar54);
            auVar53 = vunpckhps_avx512vl(auVar53,auVar54);
            auVar54 = vunpcklps_avx512vl(auVar55,auVar37);
            auVar55 = vunpckhps_avx512vl(auVar55,auVar37);
            auVar37 = *(undefined1 (*) [16])(lVar29 + uVar31 * 4);
            auVar55 = vunpcklps_avx512vl(auVar53,auVar55);
            auVar48 = vunpcklps_avx512vl(auVar51,auVar54);
            auVar51 = vunpckhps_avx512vl(auVar51,auVar54);
            auVar54 = vunpcklps_avx512vl(auVar36,auVar57);
            auVar53 = vunpckhps_avx512vl(auVar36,auVar57);
            auVar36 = vunpcklps_avx512vl(auVar56,auVar37);
            auVar56 = vunpckhps_avx512vl(auVar56,auVar37);
            auVar37 = *(undefined1 (*) [16])(lVar29 + uVar22 * 4);
            auVar53 = vunpcklps_avx(auVar53,auVar56);
            auVar56 = vunpcklps_avx512vl(auVar54,auVar36);
            auVar54 = vunpckhps_avx512vl(auVar54,auVar36);
            auVar57 = vunpcklps_avx512vl(auVar58,auVar92);
            auVar36 = vunpckhps_avx512vl(auVar58,auVar92);
            auVar58 = vunpcklps_avx512vl(auVar59,auVar37);
            auVar59 = vunpckhps_avx512vl(auVar59,auVar37);
            auVar37 = *(undefined1 (*) [16])(lVar29 + uVar26 * 4);
            auVar36 = vunpcklps_avx(auVar36,auVar59);
            auVar59 = vunpcklps_avx512vl(auVar57,auVar58);
            auVar58 = vunpckhps_avx512vl(auVar57,auVar58);
            auVar57 = vunpcklps_avx512vl(auVar61,auVar60);
            auVar60 = vunpckhps_avx512vl(auVar61,auVar60);
            auVar61 = vunpcklps_avx512vl(auVar62,auVar37);
            auVar37 = vunpckhps_avx512vl(auVar62,auVar37);
            auVar60 = vunpcklps_avx(auVar60,auVar37);
            auVar62 = vunpcklps_avx512vl(auVar57,auVar61);
            auVar61 = vunpckhps_avx512vl(auVar57,auVar61);
            auVar37 = ZEXT416((uint)(fVar99 - auVar40._0_4_));
            auVar57 = vbroadcastss_avx512vl(auVar37);
            auVar37 = vsubss_avx512f(ZEXT416(0x3f800000),auVar37);
            auVar67 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar92._0_4_ = auVar37._0_4_;
            auVar92._4_4_ = auVar92._0_4_;
            auVar92._8_4_ = auVar92._0_4_;
            auVar92._12_4_ = auVar92._0_4_;
            auVar37 = vmulps_avx512vl(auVar57,auVar48);
            auVar44 = vfmadd231ps_avx512vl(auVar37,auVar92,auVar44);
            auVar37 = vmulps_avx512vl(auVar57,auVar51);
            auVar51 = vfmadd231ps_avx512vl(auVar37,auVar92,auVar41);
            auVar37 = vmulps_avx512vl(auVar57,auVar55);
            auVar37 = vfmadd231ps_fma(auVar37,auVar92,auVar42);
            auVar55 = vmulps_avx512vl(auVar57,auVar56);
            auVar56 = vmulps_avx512vl(auVar57,auVar54);
            auVar42 = vmulps_avx512vl(auVar57,auVar53);
            auVar55 = vfmadd231ps_avx512vl(auVar55,auVar92,auVar46);
            auVar53 = vfmadd231ps_fma(auVar56,auVar92,auVar45);
            auVar45 = vfmadd231ps_fma(auVar42,auVar92,auVar47);
            auVar47 = vmulps_avx512vl(auVar57,auVar59);
            auVar58 = vmulps_avx512vl(auVar57,auVar58);
            auVar36 = vmulps_avx512vl(auVar57,auVar36);
            auVar47 = vfmadd231ps_avx512vl(auVar47,auVar92,auVar43);
            auVar38 = vfmadd231ps_fma(auVar58,auVar92,auVar38);
            auVar36 = vfmadd231ps_fma(auVar36,auVar92,auVar50);
            auVar58 = vmulps_avx512vl(auVar57,auVar62);
            auVar61 = vmulps_avx512vl(auVar57,auVar61);
            auVar50 = vmulps_avx512vl(auVar57,auVar60);
            auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar60 = vfmadd231ps_fma(auVar58,auVar92,auVar52);
            auVar58 = vfmadd231ps_fma(auVar61,auVar92,auVar49);
            auVar39 = vfmadd231ps_fma(auVar50,auVar92,auVar39);
            auVar63 = vinsertf32x4_avx512vl(ZEXT1632(auVar44),auVar47,1);
            auVar64 = vinsertf32x4_avx512vl(ZEXT1632(auVar51),auVar38,1);
            auVar71._16_16_ = auVar36;
            auVar71._0_16_ = auVar37;
            auVar73._16_16_ = auVar55;
            auVar73._0_16_ = auVar55;
            auVar76._16_16_ = auVar53;
            auVar76._0_16_ = auVar53;
            auVar74._16_16_ = auVar45;
            auVar74._0_16_ = auVar45;
            auVar78._16_16_ = auVar60;
            auVar78._0_16_ = auVar60;
            auVar75._16_16_ = auVar58;
            auVar75._0_16_ = auVar58;
            uVar90 = *(undefined4 *)&(ray->org).field_0;
            auVar79._4_4_ = uVar90;
            auVar79._0_4_ = uVar90;
            auVar79._8_4_ = uVar90;
            auVar79._12_4_ = uVar90;
            auVar79._16_4_ = uVar90;
            auVar79._20_4_ = uVar90;
            auVar79._24_4_ = uVar90;
            auVar79._28_4_ = uVar90;
            auVar65 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
            auVar69 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
            uVar90 = *(undefined4 *)&(ray->dir).field_0;
            auVar94._4_4_ = uVar90;
            auVar94._0_4_ = uVar90;
            auVar94._8_4_ = uVar90;
            auVar94._12_4_ = uVar90;
            auVar94._16_4_ = uVar90;
            auVar94._20_4_ = uVar90;
            auVar94._24_4_ = uVar90;
            auVar94._28_4_ = uVar90;
            uVar90 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
            auVar96._4_4_ = uVar90;
            auVar96._0_4_ = uVar90;
            auVar96._8_4_ = uVar90;
            auVar96._12_4_ = uVar90;
            auVar96._16_4_ = uVar90;
            auVar96._20_4_ = uVar90;
            auVar96._24_4_ = uVar90;
            auVar96._28_4_ = uVar90;
            auVar77._16_16_ = auVar39;
            auVar77._0_16_ = auVar39;
            fVar7 = (ray->dir).field_0.m128[2];
            auVar106._4_4_ = fVar7;
            auVar106._0_4_ = fVar7;
            auVar106._8_4_ = fVar7;
            auVar106._12_4_ = fVar7;
            auVar106._16_4_ = fVar7;
            auVar106._20_4_ = fVar7;
            auVar106._24_4_ = fVar7;
            auVar106._28_4_ = fVar7;
            auVar63 = vsubps_avx(auVar63,auVar79);
            auVar70 = vsubps_avx512vl(auVar64,auVar65);
            auVar71 = vsubps_avx512vl(auVar71,auVar69);
            auVar72 = vsubps_avx512vl(auVar73,auVar79);
            auVar73 = vsubps_avx512vl(auVar76,auVar65);
            auVar74 = vsubps_avx512vl(auVar74,auVar69);
            auVar64 = vsubps_avx(auVar78,auVar79);
            auVar75 = vsubps_avx512vl(auVar75,auVar65);
            auVar76 = vsubps_avx512vl(auVar77,auVar69);
            auVar65 = vsubps_avx(auVar64,auVar63);
            auVar77 = vsubps_avx512vl(auVar75,auVar70);
            auVar78 = vsubps_avx512vl(auVar76,auVar71);
            auVar79 = vsubps_avx512vl(auVar63,auVar72);
            auVar80 = vsubps_avx512vl(auVar70,auVar73);
            auVar81 = vsubps_avx512vl(auVar71,auVar74);
            auVar85._0_4_ = auVar64._0_4_ + auVar63._0_4_;
            auVar85._4_4_ = auVar64._4_4_ + auVar63._4_4_;
            auVar85._8_4_ = auVar64._8_4_ + auVar63._8_4_;
            auVar85._12_4_ = auVar64._12_4_ + auVar63._12_4_;
            auVar85._16_4_ = auVar64._16_4_ + auVar63._16_4_;
            auVar85._20_4_ = auVar64._20_4_ + auVar63._20_4_;
            auVar85._24_4_ = auVar64._24_4_ + auVar63._24_4_;
            auVar85._28_4_ = auVar64._28_4_ + auVar63._28_4_;
            auVar82 = vaddps_avx512vl(auVar75,auVar70);
            auVar83 = vaddps_avx512vl(auVar76,auVar71);
            auVar69._4_4_ = auVar78._4_4_ * auVar82._4_4_;
            auVar69._0_4_ = auVar78._0_4_ * auVar82._0_4_;
            auVar69._8_4_ = auVar78._8_4_ * auVar82._8_4_;
            auVar69._12_4_ = auVar78._12_4_ * auVar82._12_4_;
            auVar69._16_4_ = auVar78._16_4_ * auVar82._16_4_;
            auVar69._20_4_ = auVar78._20_4_ * auVar82._20_4_;
            auVar69._24_4_ = auVar78._24_4_ * auVar82._24_4_;
            auVar69._28_4_ = auVar45._12_4_;
            auVar37 = vfmsub231ps_fma(auVar69,auVar77,auVar83);
            auVar84._4_4_ = auVar65._4_4_ * auVar83._4_4_;
            auVar84._0_4_ = auVar65._0_4_ * auVar83._0_4_;
            auVar84._8_4_ = auVar65._8_4_ * auVar83._8_4_;
            auVar84._12_4_ = auVar65._12_4_ * auVar83._12_4_;
            auVar84._16_4_ = auVar65._16_4_ * auVar83._16_4_;
            auVar84._20_4_ = auVar65._20_4_ * auVar83._20_4_;
            auVar84._24_4_ = auVar65._24_4_ * auVar83._24_4_;
            auVar84._28_4_ = auVar83._28_4_;
            auVar60 = vfmsub231ps_fma(auVar84,auVar78,auVar85);
            auVar83._4_4_ = auVar77._4_4_ * auVar85._4_4_;
            auVar83._0_4_ = auVar77._0_4_ * auVar85._0_4_;
            auVar83._8_4_ = auVar77._8_4_ * auVar85._8_4_;
            auVar83._12_4_ = auVar77._12_4_ * auVar85._12_4_;
            auVar83._16_4_ = auVar77._16_4_ * auVar85._16_4_;
            auVar83._20_4_ = auVar77._20_4_ * auVar85._20_4_;
            auVar83._24_4_ = auVar77._24_4_ * auVar85._24_4_;
            auVar83._28_4_ = auVar85._28_4_;
            auVar38 = vfmsub231ps_fma(auVar83,auVar65,auVar82);
            auVar87._0_4_ = fVar7 * auVar38._0_4_;
            auVar87._4_4_ = fVar7 * auVar38._4_4_;
            auVar87._8_4_ = fVar7 * auVar38._8_4_;
            auVar87._12_4_ = fVar7 * auVar38._12_4_;
            auVar87._16_4_ = fVar7 * 0.0;
            auVar87._20_4_ = fVar7 * 0.0;
            auVar87._24_4_ = fVar7 * 0.0;
            auVar87._28_4_ = 0;
            auVar60 = vfmadd231ps_fma(auVar87,auVar96,ZEXT1632(auVar60));
            auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar94,ZEXT1632(auVar37));
            auVar69 = vaddps_avx512vl(auVar63,auVar72);
            auVar84 = vaddps_avx512vl(auVar70,auVar73);
            auVar83 = vaddps_avx512vl(auVar71,auVar74);
            auVar82 = vmulps_avx512vl(auVar84,auVar81);
            auVar85 = vfmsub231ps_avx512vl(auVar82,auVar80,auVar83);
            auVar82._4_4_ = auVar83._4_4_ * auVar79._4_4_;
            auVar82._0_4_ = auVar83._0_4_ * auVar79._0_4_;
            auVar82._8_4_ = auVar83._8_4_ * auVar79._8_4_;
            auVar82._12_4_ = auVar83._12_4_ * auVar79._12_4_;
            auVar82._16_4_ = auVar83._16_4_ * auVar79._16_4_;
            auVar82._20_4_ = auVar83._20_4_ * auVar79._20_4_;
            auVar82._24_4_ = auVar83._24_4_ * auVar79._24_4_;
            auVar82._28_4_ = auVar83._28_4_;
            auVar83 = vfmsub231ps_avx512vl(auVar82,auVar81,auVar69);
            auVar69 = vmulps_avx512vl(auVar69,auVar80);
            auVar37 = vfmsub231ps_fma(auVar69,auVar79,auVar84);
            auVar69 = vsubps_avx512vl(auVar72,auVar64);
            auVar108._0_4_ = fVar7 * auVar37._0_4_;
            auVar108._4_4_ = fVar7 * auVar37._4_4_;
            auVar108._8_4_ = fVar7 * auVar37._8_4_;
            auVar108._12_4_ = fVar7 * auVar37._12_4_;
            auVar108._16_4_ = fVar7 * 0.0;
            auVar108._20_4_ = fVar7 * 0.0;
            auVar108._24_4_ = fVar7 * 0.0;
            auVar108._28_4_ = 0;
            auVar37 = vfmadd231ps_fma(auVar108,auVar96,auVar83);
            auVar84 = vsubps_avx512vl(auVar73,auVar75);
            local_13a0 = vfmadd231ps_avx512vl(ZEXT1632(auVar37),auVar94,auVar85);
            auVar83 = vsubps_avx512vl(auVar74,auVar76);
            auVar64 = vaddps_avx512vl(auVar72,auVar64);
            auVar82 = vaddps_avx512vl(auVar73,auVar75);
            auVar72 = vaddps_avx512vl(auVar74,auVar76);
            auVar73 = vmulps_avx512vl(auVar82,auVar83);
            auVar73 = vfmsub231ps_avx512vl(auVar73,auVar84,auVar72);
            auVar72 = vmulps_avx512vl(auVar72,auVar69);
            auVar74 = vfmsub231ps_avx512vl(auVar72,auVar83,auVar64);
            auVar72._4_4_ = auVar64._4_4_ * auVar84._4_4_;
            auVar72._0_4_ = auVar64._0_4_ * auVar84._0_4_;
            auVar72._8_4_ = auVar64._8_4_ * auVar84._8_4_;
            auVar72._12_4_ = auVar64._12_4_ * auVar84._12_4_;
            auVar72._16_4_ = auVar64._16_4_ * auVar84._16_4_;
            auVar72._20_4_ = auVar64._20_4_ * auVar84._20_4_;
            auVar72._24_4_ = auVar64._24_4_ * auVar84._24_4_;
            auVar72._28_4_ = auVar64._28_4_;
            auVar64 = vfmsub231ps_avx512vl(auVar72,auVar69,auVar82);
            auVar64 = vmulps_avx512vl(auVar106,auVar64);
            auVar64 = vfmadd231ps_avx512vl(auVar64,auVar96,auVar74);
            auVar64 = vfmadd231ps_avx512vl(auVar64,auVar94,auVar73);
            auVar119._0_4_ = local_13a0._0_4_ + auVar60._0_4_;
            auVar119._4_4_ = local_13a0._4_4_ + auVar60._4_4_;
            auVar119._8_4_ = local_13a0._8_4_ + auVar60._8_4_;
            auVar119._12_4_ = local_13a0._12_4_ + auVar60._12_4_;
            auVar119._16_4_ = local_13a0._16_4_ + 0.0;
            auVar119._20_4_ = local_13a0._20_4_ + 0.0;
            auVar119._24_4_ = local_13a0._24_4_ + 0.0;
            auVar119._28_4_ = local_13a0._28_4_ + 0.0;
            local_1380 = vaddps_avx512vl(auVar64,auVar119);
            vandps_avx512vl(local_1380,auVar68);
            auVar82 = vmulps_avx512vl(local_1380,auVar67);
            auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar67 = vminps_avx512vl(ZEXT1632(auVar60),local_13a0);
            auVar67 = vminps_avx512vl(auVar67,auVar64);
            auVar73 = vxorps_avx512vl(auVar82,auVar72);
            uVar93 = vcmpps_avx512vl(auVar67,auVar73,5);
            auVar67 = vmaxps_avx512vl(ZEXT1632(auVar60),local_13a0);
            auVar64 = vmaxps_avx512vl(auVar67,auVar64);
            uVar14 = vcmpps_avx512vl(auVar64,auVar82,2);
            auVar64 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x10 + lVar30));
            local_13e0 = vmovdqa64_avx512vl(auVar64);
            auVar64 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar28 + 0x14 + lVar30));
            local_1400 = vmovdqa64_avx512vl(auVar64);
            local_1300 = (byte)uVar93 | (byte)uVar14;
            fVar99 = fStack_147c;
            fVar100 = fStack_1478;
            fVar101 = fStack_1474;
            fVar102 = fStack_1470;
            fVar103 = fStack_146c;
            fVar104 = fStack_1468;
            fVar105 = fStack_1464;
            fVar91 = local_1480;
            fVar110 = fStack_14dc;
            fVar111 = fStack_14d8;
            fVar112 = fStack_14d4;
            fVar113 = fStack_14d0;
            fVar114 = fStack_14cc;
            fVar115 = fStack_14c8;
            fVar116 = fStack_14c4;
            fVar88 = local_14e0;
            if (local_1300 == 0) {
LAB_00699436:
              auVar98 = ZEXT3264(local_1460);
              auVar107 = ZEXT3264(local_14a0);
              auVar109 = ZEXT3264(local_14c0);
              auVar117 = ZEXT3264(local_1500);
              auVar97 = ZEXT3264(local_1520);
              auVar95 = ZEXT3264(local_1540);
              auVar118 = ZEXT3264(local_1560);
            }
            else {
              auVar64 = vmulps_avx512vl(auVar78,auVar80);
              auVar82 = vmulps_avx512vl(auVar65,auVar81);
              auVar67 = vmulps_avx512vl(auVar77,auVar79);
              auVar73 = vmulps_avx512vl(auVar81,auVar84);
              auVar74 = vmulps_avx512vl(auVar79,auVar83);
              auVar75 = vmulps_avx512vl(auVar80,auVar69);
              auVar76 = vfmsub213ps_avx512vl(auVar77,auVar81,auVar64);
              auVar77 = vfmsub213ps_avx512vl(auVar78,auVar79,auVar82);
              auVar78 = vfmsub213ps_avx512vl(auVar65,auVar80,auVar67);
              auVar65 = vfmsub213ps_avx512vl(auVar83,auVar80,auVar73);
              auVar69 = vfmsub213ps_avx512vl(auVar69,auVar81,auVar74);
              auVar84 = vfmsub213ps_avx512vl(auVar84,auVar79,auVar75);
              vandps_avx512vl(auVar64,auVar68);
              vandps_avx512vl(auVar73,auVar68);
              uVar22 = vcmpps_avx512vl(auVar84,auVar84,1);
              vandps_avx512vl(auVar82,auVar68);
              vandps_avx512vl(auVar74,auVar68);
              uVar25 = vcmpps_avx512vl(auVar84,auVar84,1);
              vandps_avx512vl(auVar67,auVar68);
              vandps_avx512vl(auVar75,auVar68);
              uVar26 = vcmpps_avx512vl(auVar84,auVar84,1);
              bVar35 = (bool)((byte)uVar22 & 1);
              local_1360._0_4_ =
                   (float)((uint)bVar35 * auVar76._0_4_ | (uint)!bVar35 * auVar65._0_4_);
              bVar35 = (bool)((byte)(uVar22 >> 1) & 1);
              local_1360._4_4_ =
                   (float)((uint)bVar35 * auVar76._4_4_ | (uint)!bVar35 * auVar65._4_4_);
              bVar35 = (bool)((byte)(uVar22 >> 2) & 1);
              local_1360._8_4_ =
                   (float)((uint)bVar35 * auVar76._8_4_ | (uint)!bVar35 * auVar65._8_4_);
              bVar35 = (bool)((byte)(uVar22 >> 3) & 1);
              local_1360._12_4_ =
                   (float)((uint)bVar35 * auVar76._12_4_ | (uint)!bVar35 * auVar65._12_4_);
              bVar35 = (bool)((byte)(uVar22 >> 4) & 1);
              local_1360._16_4_ =
                   (float)((uint)bVar35 * auVar76._16_4_ | (uint)!bVar35 * auVar65._16_4_);
              bVar35 = (bool)((byte)(uVar22 >> 5) & 1);
              local_1360._20_4_ =
                   (float)((uint)bVar35 * auVar76._20_4_ | (uint)!bVar35 * auVar65._20_4_);
              bVar35 = (bool)((byte)(uVar22 >> 6) & 1);
              local_1360._24_4_ =
                   (float)((uint)bVar35 * auVar76._24_4_ | (uint)!bVar35 * auVar65._24_4_);
              bVar35 = SUB81(uVar22 >> 7,0);
              local_1360._28_4_ = (uint)bVar35 * auVar76._28_4_ | (uint)!bVar35 * auVar65._28_4_;
              bVar35 = (bool)((byte)uVar25 & 1);
              local_1340._0_4_ =
                   (float)((uint)bVar35 * auVar77._0_4_ | (uint)!bVar35 * auVar69._0_4_);
              bVar35 = (bool)((byte)(uVar25 >> 1) & 1);
              local_1340._4_4_ =
                   (float)((uint)bVar35 * auVar77._4_4_ | (uint)!bVar35 * auVar69._4_4_);
              bVar35 = (bool)((byte)(uVar25 >> 2) & 1);
              local_1340._8_4_ =
                   (float)((uint)bVar35 * auVar77._8_4_ | (uint)!bVar35 * auVar69._8_4_);
              bVar35 = (bool)((byte)(uVar25 >> 3) & 1);
              local_1340._12_4_ =
                   (float)((uint)bVar35 * auVar77._12_4_ | (uint)!bVar35 * auVar69._12_4_);
              bVar35 = (bool)((byte)(uVar25 >> 4) & 1);
              local_1340._16_4_ =
                   (float)((uint)bVar35 * auVar77._16_4_ | (uint)!bVar35 * auVar69._16_4_);
              bVar35 = (bool)((byte)(uVar25 >> 5) & 1);
              local_1340._20_4_ =
                   (float)((uint)bVar35 * auVar77._20_4_ | (uint)!bVar35 * auVar69._20_4_);
              bVar35 = (bool)((byte)(uVar25 >> 6) & 1);
              local_1340._24_4_ =
                   (float)((uint)bVar35 * auVar77._24_4_ | (uint)!bVar35 * auVar69._24_4_);
              bVar35 = SUB81(uVar25 >> 7,0);
              local_1340._28_4_ = (uint)bVar35 * auVar77._28_4_ | (uint)!bVar35 * auVar69._28_4_;
              bVar35 = (bool)((byte)uVar26 & 1);
              local_1320 = (float)((uint)bVar35 * auVar78._0_4_ | (uint)!bVar35 * auVar84._0_4_);
              bVar35 = (bool)((byte)(uVar26 >> 1) & 1);
              fStack_131c = (float)((uint)bVar35 * auVar78._4_4_ | (uint)!bVar35 * auVar84._4_4_);
              bVar35 = (bool)((byte)(uVar26 >> 2) & 1);
              fStack_1318 = (float)((uint)bVar35 * auVar78._8_4_ | (uint)!bVar35 * auVar84._8_4_);
              bVar35 = (bool)((byte)(uVar26 >> 3) & 1);
              fStack_1314 = (float)((uint)bVar35 * auVar78._12_4_ | (uint)!bVar35 * auVar84._12_4_);
              bVar35 = (bool)((byte)(uVar26 >> 4) & 1);
              fStack_1310 = (float)((uint)bVar35 * auVar78._16_4_ | (uint)!bVar35 * auVar84._16_4_);
              bVar35 = (bool)((byte)(uVar26 >> 5) & 1);
              fStack_130c = (float)((uint)bVar35 * auVar78._20_4_ | (uint)!bVar35 * auVar84._20_4_);
              bVar35 = (bool)((byte)(uVar26 >> 6) & 1);
              fStack_1308 = (float)((uint)bVar35 * auVar78._24_4_ | (uint)!bVar35 * auVar84._24_4_);
              bVar35 = SUB81(uVar26 >> 7,0);
              auVar68._4_4_ = fVar7 * fStack_131c;
              auVar68._0_4_ = fVar7 * local_1320;
              auVar68._8_4_ = fVar7 * fStack_1318;
              auVar68._12_4_ = fVar7 * fStack_1314;
              auVar68._16_4_ = fVar7 * fStack_1310;
              auVar68._20_4_ = fVar7 * fStack_130c;
              auVar68._24_4_ = fVar7 * fStack_1308;
              auVar68._28_4_ = fVar7;
              auVar37 = vfmadd213ps_fma(auVar96,local_1340,auVar68);
              auVar37 = vfmadd213ps_fma(auVar94,local_1360,ZEXT1632(auVar37));
              auVar69 = ZEXT1632(CONCAT412(auVar37._12_4_ + auVar37._12_4_,
                                           CONCAT48(auVar37._8_4_ + auVar37._8_4_,
                                                    CONCAT44(auVar37._4_4_ + auVar37._4_4_,
                                                             auVar37._0_4_ + auVar37._0_4_))));
              auVar80._0_4_ = auVar71._0_4_ * local_1320;
              auVar80._4_4_ = auVar71._4_4_ * fStack_131c;
              auVar80._8_4_ = auVar71._8_4_ * fStack_1318;
              auVar80._12_4_ = auVar71._12_4_ * fStack_1314;
              auVar80._16_4_ = auVar71._16_4_ * fStack_1310;
              auVar80._20_4_ = auVar71._20_4_ * fStack_130c;
              auVar80._24_4_ = auVar71._24_4_ * fStack_1308;
              auVar80._28_4_ = 0;
              auVar37 = vfmadd213ps_fma(auVar70,local_1340,auVar80);
              auVar38 = vfmadd213ps_fma(auVar63,local_1360,ZEXT1632(auVar37));
              auVar63 = vrcp14ps_avx512vl(auVar69);
              auVar64 = vfnmadd213ps_avx512vl(auVar63,auVar69,auVar66);
              auVar37 = vfmadd132ps_fma(auVar64,auVar63,auVar63);
              local_12a0 = ZEXT1632(CONCAT412((auVar38._12_4_ + auVar38._12_4_) * auVar37._12_4_,
                                              CONCAT48((auVar38._8_4_ + auVar38._8_4_) *
                                                       auVar37._8_4_,
                                                       CONCAT44((auVar38._4_4_ + auVar38._4_4_) *
                                                                auVar37._4_4_,
                                                                (auVar38._0_4_ + auVar38._0_4_) *
                                                                auVar37._0_4_))));
              uVar90 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar65._4_4_ = uVar90;
              auVar65._0_4_ = uVar90;
              auVar65._8_4_ = uVar90;
              auVar65._12_4_ = uVar90;
              auVar65._16_4_ = uVar90;
              auVar65._20_4_ = uVar90;
              auVar65._24_4_ = uVar90;
              auVar65._28_4_ = uVar90;
              uVar93 = vcmpps_avx512vl(local_12a0,auVar65,0xd);
              auVar63 = vxorps_avx512vl(auVar69,auVar72);
              fVar7 = ray->tfar;
              auVar67._4_4_ = fVar7;
              auVar67._0_4_ = fVar7;
              auVar67._8_4_ = fVar7;
              auVar67._12_4_ = fVar7;
              auVar67._16_4_ = fVar7;
              auVar67._20_4_ = fVar7;
              auVar67._24_4_ = fVar7;
              auVar67._28_4_ = fVar7;
              uVar14 = vcmpps_avx512vl(local_12a0,auVar67,2);
              uVar15 = vcmpps_avx512vl(auVar69,auVar63,4);
              local_1300 = (byte)uVar93 & (byte)uVar14 & (byte)uVar15 & local_1300;
              if (local_1300 == 0) goto LAB_00699436;
              local_13c0 = ZEXT1632(auVar60);
              uStack_1304 = (uint)bVar35 * auVar78._28_4_ | (uint)!bVar35 * auVar84._28_4_;
              local_1220 = 0xf0;
              auVar89._8_4_ = 0x219392ef;
              auVar89._0_8_ = 0x219392ef219392ef;
              auVar89._12_4_ = 0x219392ef;
              auVar89._16_4_ = 0x219392ef;
              auVar89._20_4_ = 0x219392ef;
              auVar89._24_4_ = 0x219392ef;
              auVar89._28_4_ = 0x219392ef;
              uVar22 = vcmpps_avx512vl(local_1380,auVar89,5);
              auVar63 = vrcp14ps_avx512vl(local_1380);
              auVar64 = vfnmadd213ps_avx512vl(local_1380,auVar63,auVar66);
              auVar64 = vfmadd132ps_avx512vl(auVar64,auVar63,auVar63);
              fVar1 = (float)((uint)((byte)uVar22 & 1) * auVar64._0_4_);
              fVar7 = (float)((uint)((byte)(uVar22 >> 1) & 1) * auVar64._4_4_);
              fVar2 = (float)((uint)((byte)(uVar22 >> 2) & 1) * auVar64._8_4_);
              fVar3 = (float)((uint)((byte)(uVar22 >> 3) & 1) * auVar64._12_4_);
              fVar4 = (float)((uint)((byte)(uVar22 >> 4) & 1) * auVar64._16_4_);
              fVar5 = (float)((uint)((byte)(uVar22 >> 5) & 1) * auVar64._20_4_);
              fVar6 = (float)((uint)((byte)(uVar22 >> 6) & 1) * auVar64._24_4_);
              auVar81._0_4_ = fVar1 * auVar60._0_4_;
              auVar81._4_4_ = fVar7 * auVar60._4_4_;
              auVar81._8_4_ = fVar2 * auVar60._8_4_;
              auVar81._12_4_ = fVar3 * auVar60._12_4_;
              auVar81._16_4_ = fVar4 * 0.0;
              auVar81._20_4_ = fVar5 * 0.0;
              auVar81._24_4_ = fVar6 * 0.0;
              auVar81._28_4_ = 0;
              auVar64 = vminps_avx512vl(auVar81,auVar66);
              auVar70._4_4_ = local_13a0._4_4_ * fVar7;
              auVar70._0_4_ = local_13a0._0_4_ * fVar1;
              auVar70._8_4_ = local_13a0._8_4_ * fVar2;
              auVar70._12_4_ = local_13a0._12_4_ * fVar3;
              auVar70._16_4_ = local_13a0._16_4_ * fVar4;
              auVar70._20_4_ = local_13a0._20_4_ * fVar5;
              auVar70._24_4_ = local_13a0._24_4_ * fVar6;
              auVar70._28_4_ = auVar63._28_4_;
              auVar63 = vminps_avx512vl(auVar70,auVar66);
              auVar65 = vsubps_avx512vl(auVar66,auVar64);
              auVar69 = vsubps_avx512vl(auVar66,auVar63);
              local_12c0 = vblendps_avx(auVar63,auVar65,0xf0);
              local_12e0 = vblendps_avx(auVar64,auVar69,0xf0);
              local_1280[0] = local_1360._0_4_ * 1.0;
              local_1280[1] = local_1360._4_4_ * 1.0;
              local_1280[2] = local_1360._8_4_ * 1.0;
              local_1280[3] = local_1360._12_4_ * 1.0;
              fStack_1270 = local_1360._16_4_ * -1.0;
              fStack_126c = local_1360._20_4_ * -1.0;
              fStack_1268 = local_1360._24_4_ * -1.0;
              uStack_1264 = local_12e0._28_4_;
              local_1240._4_4_ = fStack_131c * 1.0;
              local_1240._0_4_ = local_1320 * 1.0;
              local_1240._8_4_ = fStack_1318 * 1.0;
              local_1240._12_4_ = fStack_1314 * 1.0;
              local_1240._16_4_ = fStack_1310 * -1.0;
              local_1240._20_4_ = fStack_130c * -1.0;
              local_1240._24_4_ = fStack_1308 * -1.0;
              local_1240._28_4_ = local_12e0._28_4_;
              local_1260[0] = local_1340._0_4_ * 1.0;
              local_1260[1] = local_1340._4_4_ * 1.0;
              local_1260[2] = local_1340._8_4_ * 1.0;
              local_1260[3] = local_1340._12_4_ * 1.0;
              fStack_1250 = local_1340._16_4_ * -1.0;
              fStack_124c = local_1340._20_4_ * -1.0;
              fStack_1248 = local_1340._24_4_ * -1.0;
              uStack_1244 = local_12c0._28_4_;
              uVar22 = (ulong)local_1300;
              auVar98 = ZEXT3264(local_1460);
              auVar107 = ZEXT3264(local_14a0);
              auVar109 = ZEXT3264(local_14c0);
              auVar117 = ZEXT3264(local_1500);
              auVar97 = ZEXT3264(local_1520);
              auVar95 = ZEXT3264(local_1540);
              auVar118 = ZEXT3264(local_1560);
              do {
                auVar60 = auVar120._0_16_;
                uVar25 = 0;
                for (uVar26 = uVar22; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
                {
                  uVar25 = uVar25 + 1;
                }
                local_15d8 = (pSVar9->geometries).items[*(uint *)(local_13e0 + uVar25 * 4)].ptr;
                if ((local_15d8->mask & ray->mask) != 0) {
                  pRVar33 = context->args;
                  if ((pRVar33->filter == (RTCFilterFunctionN)0x0) &&
                     (local_15d8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006994d6:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  local_1440 = auVar122._0_32_;
                  local_1420 = auVar121._0_32_;
                  uVar26 = (ulong)(uint)((int)uVar25 * 4);
                  local_1590.context = context->user;
                  local_15c0 = *(undefined4 *)((long)local_1280 + uVar26);
                  local_15bc = *(undefined4 *)((long)local_1260 + uVar26);
                  local_15b8 = *(undefined4 *)(local_1240 + uVar26);
                  local_15b4 = *(undefined4 *)(local_12e0 + uVar26);
                  local_15b0 = *(undefined4 *)(local_12c0 + uVar26);
                  local_15ac = *(undefined4 *)(local_1400 + uVar26);
                  local_15a8 = *(uint *)(local_13e0 + uVar25 * 4);
                  local_15a4 = (local_1590.context)->instID[0];
                  local_15a0 = (local_1590.context)->instPrimID[0];
                  fVar99 = ray->tfar;
                  ray->tfar = *(float *)(local_12a0 + uVar26);
                  local_15e4 = -1;
                  local_1590.valid = &local_15e4;
                  local_1590.geometryUserPtr = local_15d8->userPtr;
                  local_1590.hit = (RTCHitN *)&local_15c0;
                  local_1590.N = 1;
                  local_1590.ray = (RTCRayN *)ray;
                  if (((local_15d8->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                      (local_15e0 = pRVar33, (*local_15d8->occlusionFilterN)(&local_1590),
                      pRVar33 = local_15e0, *local_1590.valid != 0)) &&
                     ((pRVar33->filter == (RTCFilterFunctionN)0x0 ||
                      ((((pRVar33->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT &&
                        (((local_15d8->field_8).field_0x2 & 0x40) == 0)) ||
                       ((*pRVar33->filter)(&local_1590), *local_1590.valid != 0))))))
                  goto LAB_006994d6;
                  ray->tfar = fVar99;
                  auVar60 = vxorps_avx512vl(auVar60,auVar60);
                  auVar120 = ZEXT1664(auVar60);
                  auVar121 = ZEXT3264(local_1420);
                  auVar122 = ZEXT3264(local_1440);
                  auVar98 = ZEXT3264(local_1460);
                  auVar107 = ZEXT3264(local_14a0);
                  auVar109 = ZEXT3264(local_14c0);
                  auVar117 = ZEXT3264(local_1500);
                  auVar97 = ZEXT3264(local_1520);
                  auVar95 = ZEXT3264(local_1540);
                  auVar118 = ZEXT3264(local_1560);
                  fVar91 = local_1480;
                  fVar99 = fStack_147c;
                  fVar100 = fStack_1478;
                  fVar101 = fStack_1474;
                  fVar102 = fStack_1470;
                  fVar103 = fStack_146c;
                  fVar104 = fStack_1468;
                  fVar105 = fStack_1464;
                  fVar88 = local_14e0;
                  fVar110 = fStack_14dc;
                  fVar111 = fStack_14d8;
                  fVar112 = fStack_14d4;
                  fVar113 = fStack_14d0;
                  fVar114 = fStack_14cc;
                  fVar115 = fStack_14c8;
                  fVar116 = fStack_14c4;
                }
                uVar22 = uVar22 ^ 1L << (uVar25 & 0x3f);
              } while (uVar22 != 0);
            }
            local_15c8 = local_15c8 + 1;
          } while (local_15c8 != local_15d0);
        }
LAB_006994be:
      } while (puVar32 != &local_1200);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }